

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_property_name(parser *this)

{
  bool bVar1;
  token_type tVar2;
  int iVar3;
  pointer peVar4;
  parser *in_RSI;
  bool bVar5;
  token local_70;
  undefined1 local_38 [8];
  position_stack_node _expression_position__LINE__;
  parser *this_local;
  expression_ptr *p;
  
  position_stack_node::position_stack_node
            ((position_stack_node *)local_38,in_RSI,&in_RSI->expression_pos_);
  tVar2 = current_token_type(in_RSI);
  if ((tVar2 == string_literal) || (tVar2 = current_token_type(in_RSI), tVar2 == numeric_literal)) {
    check_literal(in_RSI);
    get_token(&local_70,in_RSI);
    make_expression<mjs::literal_expression,mjs::token>(this,(token *)in_RSI);
    token::~token(&local_70);
  }
  else {
    parse_identifier_name(this,(char *)in_RSI,0x29f43a);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
    bVar5 = false;
    if (bVar1) {
      peVar4 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator->
                         ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this
                         );
      iVar3 = (*(peVar4->super_syntax_node)._vptr_syntax_node[3])();
      bVar5 = iVar3 == 0;
    }
    if (!bVar5) {
      __assert_fail("p && p->type() == expression_type::identifier",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                    ,0x436,"expression_ptr mjs::parser::parse_property_name()");
    }
  }
  position_stack_node::~position_stack_node((position_stack_node *)local_38);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parser::parse_property_name() {
    RECORD_EXPRESSION_START;
    if (current_token_type() == token_type::string_literal || current_token_type() == token_type::numeric_literal) {
        check_literal();
        return make_expression<literal_expression>(get_token());
    } else {
        auto p = parse_identifier_name(__func__, __LINE__);
        assert(p && p->type() == expression_type::identifier);
        return p;
    }
}